

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_scalar(Mat *a,float b,Mat *c,int op_type,Option *opt)

{
  long *in_RSI;
  long *in_RDI;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  Mat *m;
  Mat *m_1;
  int in_stack_fffffffffffffd34;
  float *in_stack_fffffffffffffd48;
  float local_278 [8];
  long local_258;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined8 local_238;
  float *local_230;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined4 local_200;
  long local_1f8;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined8 local_1d8;
  long local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  long *local_1a8;
  long *local_198;
  undefined8 *local_190;
  float *local_180;
  float *local_158;
  undefined8 *local_138;
  undefined1 local_10d;
  int local_10c;
  undefined8 *local_100;
  undefined8 *local_d8;
  undefined1 local_cd;
  int local_cc;
  float *local_c0;
  float *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  float *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  float *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_1bc = (int)in_RDI[7];
  local_1c0 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_1a8 = in_RSI;
  local_198 = in_RDI;
  for (local_1c4 = 0; local_1c4 < local_1bc; local_1c4 = local_1c4 + 1) {
    local_100 = &local_218;
    local_2c = *(int *)((long)local_198 + 0x2c);
    local_30 = (int)local_198[6];
    local_34 = *(undefined4 *)((long)local_198 + 0x34);
    local_1d0 = *local_198 + local_198[8] * (long)local_1c4 * local_198[2];
    local_48 = local_198[2];
    local_4c = (undefined4)local_198[3];
    local_58 = local_198[4];
    local_28 = &local_218;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_d8 = &local_218;
    local_190 = &local_218;
    local_1c = 0x10;
    local_10c = local_1c4;
    local_10d = 1;
    local_218 = 0;
    local_208 = 0;
    local_200 = 0;
    local_1f0 = 0;
    local_1ec = 0;
    local_1e8 = 0;
    local_1e4 = 0;
    local_1e0 = 0;
    local_1d8 = 0;
    local_210 = 0;
    local_c0 = local_278;
    local_64 = *(int *)((long)local_1a8 + 0x2c);
    local_68 = (int)local_1a8[6];
    local_6c = *(undefined4 *)((long)local_1a8 + 0x34);
    local_230 = (float *)(*local_1a8 + local_1a8[8] * (long)local_1c4 * local_1a8[2]);
    local_80 = local_1a8[2];
    local_84 = (undefined4)local_1a8[3];
    local_90 = local_1a8[4];
    local_60 = local_278;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_98 = local_278;
    local_180 = local_278;
    local_c = 0x10;
    local_cc = local_1c4;
    local_cd = 1;
    local_278[0] = 0.0;
    local_278[1] = 0.0;
    local_278[4] = 0.0;
    local_278[5] = 0.0;
    local_278[6] = 0.0;
    local_250 = 0;
    local_24c = 0;
    local_248 = 0;
    local_244 = 0;
    local_240 = 0;
    local_238 = 0;
    local_278[2] = 0.0;
    local_278[3] = 0.0;
    local_158 = local_180;
    local_138 = local_190;
    local_78 = local_230;
    local_40 = local_1d0;
    local_258 = local_90;
    local_1f8 = local_58;
    binary_op_vector(local_60,in_stack_fffffffffffffd48,local_230,(int)((ulong)local_180 >> 0x20),
                     (int)local_180,in_stack_fffffffffffffd34,(int)local_190,(int)local_1d0);
  }
  return;
}

Assistant:

static void binary_op_scalar(const Mat& a, float b, Mat& c, int op_type, const Option& opt)
{
    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        binary_op_vector(ptr, &b, outptr, size, 1, 1, 1, op_type);
    }
}